

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

void __thiscall boundingBoxTy::enlarge_m(boundingBoxTy *this,double x,double y)

{
  long lVar1;
  positionTy *p;
  positionTy *ppVar2;
  boundingBoxTy *pbVar3;
  positionTy *ppVar4;
  byte bVar5;
  double dVar6;
  vectorTy local_80;
  positionTy local_60;
  
  bVar5 = 0;
  dVar6 = (double)(~-(ulong)NAN(y) & (ulong)y | -(ulong)NAN(y) & (ulong)x);
  dVar6 = SQRT(x * x + dVar6 * dVar6);
  local_80.angle = 315.0;
  local_80.vsi = NAN;
  local_80.speed = NAN;
  local_80.dist = dVar6;
  CoordPlusVector(&local_60,&this->nw,&local_80);
  ppVar2 = &local_60;
  pbVar3 = this;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pbVar3->nw)._lat = ppVar2->_lat;
    ppVar2 = (positionTy *)((long)ppVar2 + (ulong)bVar5 * -0x10 + 8);
    pbVar3 = (boundingBoxTy *)((long)pbVar3 + (ulong)bVar5 * -0x10 + 8);
  }
  positionTy::normalize(&this->nw);
  local_80.angle = 135.0;
  local_80.vsi = NAN;
  local_80.speed = NAN;
  p = &this->se;
  local_80.dist = dVar6;
  CoordPlusVector(&local_60,p,&local_80);
  ppVar2 = &local_60;
  ppVar4 = p;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    ppVar4->_lat = ppVar2->_lat;
    ppVar2 = (positionTy *)((long)ppVar2 + (ulong)bVar5 * -0x10 + 8);
    ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  positionTy::normalize(p);
  return;
}

Assistant:

void boundingBoxTy::enlarge_m (double x, double y)
{
    // height defaults to width
    if (std::isnan(y)) y = x;
    
    // we move 45 degrees from the center point to the nw and se corners,
    // use good ole pythagoras, probably not _exact_ but good enough here
    const double d = sqrt(x*x + y*y);
    
    // let's move the corners out:
    nw += vectorTy ( 315, d, NAN, NAN );
    se += vectorTy ( 135, d, NAN, NAN );
}